

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void flush_and_trigger(EVclient client,int reconfig)

{
  EVflush_attrs_reconfig_ptr p_Var1;
  CMConnection conn;
  int in_ESI;
  undefined8 *in_RDI;
  EVclient unaff_retaddr;
  CMFormat flush_msg;
  EVflush_attrs_reconfig_ptr msg;
  int in_stack_00000054;
  CMConnection in_stack_00000058;
  EVmaster_msg_type in_stack_00000064;
  void *in_stack_00000068;
  EVmaster in_stack_00000070;
  CMFormat in_stack_ffffffffffffffd8;
  
  p_Var1 = build_attrs_msg(unaff_retaddr);
  conn = (CMConnection)INT_CMlookup_format((CManager)*in_RDI,EVdfg_flush_attrs_reconfig_format_list)
  ;
  p_Var1->reconfig = in_ESI;
  if (in_RDI[4] == 0) {
    queue_master_msg(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058,
                     in_stack_00000054);
  }
  else {
    INT_CMwrite(conn,in_stack_ffffffffffffffd8,(void *)0x1697a4);
    free_attrs_msg((EVflush_attrs_reconfig_ptr)conn);
  }
  return;
}

Assistant:

static void
flush_and_trigger(EVclient client, int reconfig)
{
    EVflush_attrs_reconfig_ptr msg = build_attrs_msg(client);
    CMFormat flush_msg = INT_CMlookup_format(client->cm, EVdfg_flush_attrs_reconfig_format_list);
    msg->reconfig = reconfig;
    if (client->master_connection != NULL) {
	/* we are a client, send the reconfig to the master */
	INT_CMwrite(client->master_connection, flush_msg, msg);
	free_attrs_msg(msg);
    } else {
	queue_master_msg(client->master, &flush_msg, DFGflush_reconfig, NULL, /*copy*/ 0);
    }
}